

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_line_directive
          (CompilerGLSL *this,uint32_t file_id,uint32_t line_literal)

{
  uint32_t uVar1;
  SPIRString *pSVar2;
  uint32_t local_44;
  string local_40;
  
  if ((this->redirect_statement ==
       (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        *)0x0) && ((this->options).emit_line_directives == true)) {
    local_44 = line_literal;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"GL_GOOGLE_cpp_style_line_directive","");
    require_extension_internal(this,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    pSVar2 = Variant::get<spirv_cross::SPIRString>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        file_id);
    uVar1 = this->indent;
    this->indent = 0;
    statement<char_const(&)[7],unsigned_int&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (this,(char (*) [7])"#line ",&local_44,(char (*) [3])" \"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pSVar2->str,
               (char (*) [2])0x348866);
    this->indent = uVar1;
  }
  return;
}

Assistant:

void CompilerGLSL::emit_line_directive(uint32_t file_id, uint32_t line_literal)
{
	// If we are redirecting statements, ignore the line directive.
	// Common case here is continue blocks.
	if (redirect_statement)
		return;

	if (options.emit_line_directives)
	{
		require_extension_internal("GL_GOOGLE_cpp_style_line_directive");
		statement_no_indent("#line ", line_literal, " \"", get<SPIRString>(file_id).str, "\"");
	}
}